

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

size_type fs_max_component(string_view path)

{
  int *piVar1;
  size_type sVar2;
  string_view fname;
  error_code ec;
  
  ec._M_cat = (error_category *)std::_V2::generic_category();
  ec._M_value = 0x16;
  piVar1 = __errno_location();
  *piVar1 = 0;
  sVar2 = pathconf(path._M_str,3);
  if (sVar2 == 0xffffffffffffffff) {
    if (*piVar1 == 0) {
      sVar2 = 0x100;
    }
    else {
      fname._M_str = "fs_max_component";
      fname._M_len = 0x10;
      fs_print_error(path,fname,&ec);
      sVar2 = 0;
    }
  }
  return sVar2;
}

Assistant:

std::string::size_type fs_max_component(std::string_view path)
{
  // maximum length of each component of a path. That is, while the maximum
  // total length of a path may be thousands of character, each segment of the
  // path has a maximum length too--typically 255 characters.

  std::error_code ec = std::make_error_code(std::errc::invalid_argument);

#ifdef _WIN32
  if(DWORD L = 0;
      GetVolumeInformationA(fs_root(path).data(), nullptr, 0, nullptr, &L, nullptr, nullptr, 0) != 0)  FFS_LIKELY
    return L;
#elif defined(_PC_NAME_MAX)
  errno = 0;
  auto const r = pathconf(path.data(), _PC_NAME_MAX);
  if(r != -1)
    return r;
  if(errno == 0)
    return DEFAULT_MAX_PATH;
#elif defined(NAME_MAX)
  return NAME_MAX;
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(path, __func__, ec);
  return {};
}